

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O1

void __thiscall Lexer::Lexer(Lexer *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long *plVar3;
  undefined4 *puVar4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  *ppVar5;
  long *plVar6;
  initializer_list<std::pair<const_char,_lexemtype>_> __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>
  __l_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>
  __l_01;
  allocator_type local_102;
  less<char> local_101;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
  *local_100;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  local_f8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined4 local_b0;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined4 local_88;
  long *local_80 [2];
  long local_70 [2];
  undefined4 local_60;
  long *local_58 [2];
  long local_48 [2];
  undefined4 local_38;
  
  puVar4 = &DAT_0010d0d4;
  ppVar5 = &local_f8;
  for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(undefined4 *)&(ppVar5->first)._M_dataplus._M_p = *puVar4;
    puVar4 = puVar4 + 1;
    ppVar5 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
              *)((long)&(ppVar5->first)._M_dataplus._M_p + 4);
  }
  __l._M_len = 0xe;
  __l._M_array = (iterator)&local_f8;
  std::map<char,_lexemtype,_std::less<char>,_std::allocator<std::pair<const_char,_lexemtype>_>_>::
  map(&this->SYMBOLS,__l,&local_101,&local_102);
  local_f8.first._M_dataplus._M_p = (pointer)&local_f8.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"return","");
  local_f8.second = RETURNKW;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"if","");
  local_b0 = 8;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"else","");
  local_88 = 9;
  plVar6 = local_70;
  local_80[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"while","");
  local_60 = 0xb;
  plVar3 = local_48;
  local_58[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"for","");
  local_100 = &this->KEYWORDS;
  local_38 = 10;
  __l_00._M_len = 5;
  __l_00._M_array = &local_f8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
  ::map(local_100,__l_00,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_101,(allocator_type *)&local_102);
  lVar2 = -200;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -5;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0);
  local_f8.first._M_dataplus._M_p = (pointer)&local_f8.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"int","");
  local_f8.second = INTKW;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"double","");
  local_b0 = 0x16;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"char","");
  local_88 = 0x17;
  local_80[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"float","");
  local_60 = 0x18;
  __l_01._M_len = 4;
  __l_01._M_array = &local_f8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
  ::map(&this->DATA_TYPES,__l_01,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_101,(allocator_type *)&local_102);
  lVar2 = -0xa0;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -5;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0);
  this->ch = ' ';
  *(undefined8 *)&this->lexem = 0;
  (this->lexem).value._M_dataplus._M_p = (pointer)0x0;
  (this->lexem).value._M_string_length = 0;
  (this->lexem).value.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->lexem).value.field_2 + 8) = 0;
  (this->lexem).value._M_dataplus._M_p = (pointer)&(this->lexem).value.field_2;
  (this->lexem).value._M_string_length = 0;
  (this->lexem).value.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->table)._M_t._M_impl.super__Rb_tree_header;
  (this->table)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->table)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->table)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Lexer() = default;